

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::AdamOptimizer::SharedDtor(AdamOptimizer *this)

{
  DoubleParameter *pDVar1;
  Int64Parameter *this_00;
  Arena *pAVar2;
  LogMessage *other;
  AdamOptimizer *pAVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  AdamOptimizer *local_10;
  AdamOptimizer *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xed22);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pAVar3 = internal_default_instance();
  if ((this != pAVar3) && (pDVar1 = this->learningrate_, pDVar1 != (DoubleParameter *)0x0)) {
    DoubleParameter::~DoubleParameter(pDVar1);
    operator_delete(pDVar1,0x28);
  }
  pAVar3 = internal_default_instance();
  if ((this != pAVar3) && (this_00 = this->minibatchsize_, this_00 != (Int64Parameter *)0x0)) {
    Int64Parameter::~Int64Parameter(this_00);
    operator_delete(this_00,0x28);
  }
  pAVar3 = internal_default_instance();
  if ((this != pAVar3) && (pDVar1 = this->beta1_, pDVar1 != (DoubleParameter *)0x0)) {
    DoubleParameter::~DoubleParameter(pDVar1);
    operator_delete(pDVar1,0x28);
  }
  pAVar3 = internal_default_instance();
  if ((this != pAVar3) && (pDVar1 = this->beta2_, pDVar1 != (DoubleParameter *)0x0)) {
    DoubleParameter::~DoubleParameter(pDVar1);
    operator_delete(pDVar1,0x28);
  }
  pAVar3 = internal_default_instance();
  if ((this != pAVar3) && (pDVar1 = this->eps_, pDVar1 != (DoubleParameter *)0x0)) {
    DoubleParameter::~DoubleParameter(pDVar1);
    operator_delete(pDVar1,0x28);
  }
  return;
}

Assistant:

inline void AdamOptimizer::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete learningrate_;
  if (this != internal_default_instance()) delete minibatchsize_;
  if (this != internal_default_instance()) delete beta1_;
  if (this != internal_default_instance()) delete beta2_;
  if (this != internal_default_instance()) delete eps_;
}